

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_print_patch_file(FILE *file,Integer g_a,Integer *lo,Integer *hi,Integer pretty)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Integer IVar5;
  long *in_RCX;
  long lVar6;
  long in_RDX;
  ulong in_RSI;
  FILE *in_RDI;
  long in_R8;
  Integer status_3d;
  Integer status_2d;
  Integer done;
  longlong llbuf_2d [36];
  longlong llbuf [6];
  long lbuf_2d [36];
  long lbuf [6];
  Integer hip [7];
  Integer lop [7];
  float fcbuf_2d [108];
  float fcbuf [12];
  float fbuf_2d [36];
  float fbuf [6];
  DoublePrecision dcbuf_2d [72];
  DoublePrecision dcbuf [12];
  DoublePrecision dbuf_2d [36];
  DoublePrecision dbuf [6];
  int ibuf_2d [36];
  int ibuf [6];
  Integer bufsize;
  Integer ld [7];
  Integer dims [7];
  Integer ndim;
  char *name;
  Integer type;
  Integer j;
  Integer i;
  long local_b90;
  long local_b88;
  long local_b80;
  long local_b60;
  long local_b58;
  long local_b50;
  long local_b38;
  undefined8 local_b18 [36];
  Integer in_stack_fffffffffffff608;
  char *in_stack_fffffffffffff610;
  Integer *in_stack_fffffffffffff620;
  void *in_stack_fffffffffffff628;
  Integer *in_stack_fffffffffffff630;
  Integer *in_stack_fffffffffffff638;
  Integer in_stack_fffffffffffff640;
  char **in_stack_fffffffffffff668;
  Integer in_stack_fffffffffffff670;
  Integer *in_stack_fffffffffffff678;
  Integer *in_stack_fffffffffffff680;
  Integer *in_stack_fffffffffffff688;
  Integer in_stack_fffffffffffff690;
  undefined8 local_8a8 [6];
  long local_878 [8];
  long local_838 [8];
  float local_7f8 [108];
  float local_648 [12];
  float local_618 [36];
  float local_588 [8];
  double local_568 [72];
  double local_328 [12];
  double local_2c8 [36];
  double local_1a8 [6];
  uint local_178 [36];
  uint local_e8 [6];
  long local_d0;
  long local_c8 [8];
  long local_88 [7];
  long local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  ulong local_10;
  FILE *local_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pnga_sync();
  pnga_check_handle(in_stack_fffffffffffff670,(char *)in_stack_fffffffffffff668);
  IVar5 = pnga_nodeid();
  if (IVar5 == 0) {
    pnga_inquire(in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff678);
    pnga_inquire_name(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
      if ((*(long *)(local_18 + local_30 * 8) < 1) || (local_88[local_30] < local_20[local_30])) {
        pnga_error(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
      }
    }
    fprintf(local_8,"\n global array: %s[",local_48);
    for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
      if (local_30 == local_50 + -1) {
        fprintf(local_8,"%ld:%ld",*(undefined8 *)(local_18 + local_30 * 8),local_20[local_30]);
      }
      else {
        fprintf(local_8,"%ld:%ld,",*(undefined8 *)(local_18 + local_30 * 8),local_20[local_30]);
      }
    }
    fprintf(local_8,"],  handle: %d \n",local_10 & 0xffffffff);
    iVar4 = 6;
    if (local_40 == 0x3ee) {
      iVar4 = 3;
    }
    local_d0 = (long)iVar4;
    for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
      local_c8[local_30] = (long)iVar4;
    }
    if (local_28 == 0) {
      bVar1 = true;
      for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
        local_838[local_30] = *(long *)(local_18 + local_30 * 8);
        local_878[local_30] = *(long *)(local_18 + local_30 * 8);
      }
      if (*local_20 < local_838[0] + local_d0 + -1) {
        local_b38 = *local_20;
      }
      else {
        local_b38 = local_838[0] + local_d0 + -1;
      }
      local_878[0] = local_b38;
      while (bVar1) {
        switch(local_40) {
        case 0x3e9:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ea:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3eb:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ec:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        default:
          pnga_error(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
          break;
        case 0x3ee:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ef:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3f8:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
        }
        for (local_30 = 0; local_30 < (local_878[0] - local_838[0]) + 1; local_30 = local_30 + 1) {
          fprintf(local_8,"%s(",local_48);
          for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
            if ((local_38 == 0) && (local_50 == 1)) {
              fprintf(local_8,"%ld",local_838[0] + local_30);
            }
            else if ((local_38 == 0) || (local_38 != local_50 + -1)) {
              if ((local_38 == 0) && (local_50 != 1)) {
                fprintf(local_8,"%ld,",local_838[0] + local_30);
              }
              else {
                fprintf(local_8,"%ld,",local_838[local_38]);
              }
            }
            else {
              fprintf(local_8,"%ld",local_838[local_38]);
            }
          }
          switch(local_40) {
          case 0x3e9:
            fprintf(local_8,") = %d\n",(ulong)local_e8[local_30]);
            break;
          case 0x3ea:
            fprintf(local_8,") = %ld\n",local_8a8[local_30]);
            break;
          case 0x3eb:
            fprintf(local_8,") = %f\n",(double)local_588[local_30]);
            break;
          case 0x3ec:
            if (100000.0 < local_1a8[local_30] || local_1a8[local_30] == 100000.0) {
              fprintf(local_8,") = %e\n",local_1a8[local_30]);
            }
            else {
              fprintf(local_8,") = %f\n",local_1a8[local_30]);
            }
            break;
          case 0x3ee:
            if ((100000.0 <= local_648[local_30 * 2]) || (100000.0 <= local_648[local_30 * 2 + 1]))
            {
              fprintf(local_8,") = (%e,%e)\n",(double)local_648[local_30 * 2],
                      (double)local_648[local_30 * 2 + 1]);
            }
            else {
              fprintf(local_8,") = (%f,%f)\n",(double)local_648[local_30 * 2],
                      (double)local_648[local_30 * 2 + 1]);
            }
            break;
          case 0x3ef:
            if ((100000.0 < local_328[local_30 * 2] || local_328[local_30 * 2] == 100000.0) ||
               (100000.0 < local_328[local_30 * 2 + 1] || local_328[local_30 * 2 + 1] == 100000.0))
            {
              fprintf(local_8,") = (%e,%e)\n",local_328[local_30 * 2],local_328[local_30 * 2 + 1]);
            }
            else {
              fprintf(local_8,") = (%f,%f)\n",local_328[local_30 * 2],local_328[local_30 * 2 + 1]);
            }
            break;
          case 0x3f8:
            fprintf(local_8,") = %lld\n",*(undefined8 *)(&stack0xfffffffffffff608 + local_30 * 8));
          }
        }
        fflush(local_8);
        local_838[0] = local_878[0] + 1;
        if (*local_20 < local_838[0] + local_d0 + -1) {
          local_b50 = *local_20;
        }
        else {
          local_b50 = local_838[0] + local_d0 + -1;
        }
        local_878[0] = local_b50;
        for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
          if (local_20[local_30] < local_838[local_30]) {
            if (local_30 == local_50 + -1) {
              bVar1 = false;
            }
            else {
              local_838[local_30] = *(long *)(local_18 + local_30 * 8);
              if (local_30 == 0) {
                if (*local_20 < local_838[0] + local_d0 + -1) {
                  local_b58 = *local_20;
                }
                else {
                  local_b58 = local_838[0] + local_d0 + -1;
                }
                local_878[0] = local_b58;
              }
              else {
                local_878[local_30] = *(long *)(local_18 + local_30 * 8);
              }
              local_838[local_30 + 1] = local_838[local_30 + 1] + 1;
              local_878[local_30 + 1] = local_878[local_30 + 1] + 1;
            }
          }
        }
      }
    }
    else {
      bVar1 = true;
      for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
        local_838[local_30] = *(long *)(local_18 + local_30 * 8);
        if ((local_30 == 0) || (local_30 == 1)) {
          if (local_20[local_30] < local_838[local_30] + local_d0 + -1) {
            local_b60 = local_20[local_30];
          }
          else {
            local_b60 = local_838[local_30] + local_d0 + -1;
          }
          local_878[local_30] = local_b60;
        }
        else {
          local_878[local_30] = *(long *)(local_18 + local_30 * 8);
        }
      }
      bVar3 = true;
      bVar2 = true;
      while (bVar1) {
        if ((bVar2) && (2 < local_50)) {
          fprintf(local_8,"\n -- patch: %s[",local_48);
          for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
            if (local_30 < 2) {
              if (local_30 == local_50 + -1) {
                fprintf(local_8,"%ld:%ld",*(undefined8 *)(local_18 + local_30 * 8),
                        local_20[local_30]);
              }
              else {
                fprintf(local_8,"%ld:%ld,",*(undefined8 *)(local_18 + local_30 * 8),
                        local_20[local_30]);
              }
            }
            else if (local_30 == local_50 + -1) {
              fprintf(local_8,"%ld",local_838[local_30]);
            }
            else {
              fprintf(local_8,"%ld,",local_838[local_30]);
            }
          }
          fprintf(local_8,"]\n");
          bVar2 = false;
        }
        if ((bVar3) && (1 < local_50)) {
          fprintf(local_8,"\n");
          switch(local_40) {
          case 0x3e9:
            fprintf(local_8,"     ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%7ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," --------");
            }
            break;
          case 0x3ea:
            fprintf(local_8,"     ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%7ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," --------");
            }
            break;
          case 0x3eb:
            fprintf(local_8,"     ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%7ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," --------");
            }
            break;
          case 0x3ec:
            fprintf(local_8,"   ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%10ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," -----------");
            }
            break;
          default:
            pnga_error(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
            break;
          case 0x3ee:
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%22ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," -----------------------");
            }
            break;
          case 0x3ef:
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%22ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," -----------------------");
            }
            break;
          case 0x3f8:
            fprintf(local_8,"     ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8,"%7ld  ",local_30);
            }
            fprintf(local_8,"\n      ");
            for (local_30 = local_838[1]; local_30 <= local_878[1]; local_30 = local_30 + 1) {
              fprintf(local_8," --------");
            }
          }
          fprintf(local_8,"\n");
          bVar3 = false;
        }
        switch(local_40) {
        case 0x3e9:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ea:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3eb:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ec:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        default:
          pnga_error(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
          break;
        case 0x3ee:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3ef:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
          break;
        case 0x3f8:
          pnga_get(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                   in_stack_fffffffffffff628,in_stack_fffffffffffff620);
        }
        for (local_30 = 0; local_30 < (local_878[0] - local_838[0]) + 1; local_30 = local_30 + 1) {
          fprintf(local_8,"%4ld  ",local_838[0] + local_30);
          switch(local_40) {
          case 0x3e9:
            if (local_50 < 2) {
              fprintf(local_8," %8d",(ulong)local_178[local_30]);
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                fprintf(local_8," %8d",(ulong)local_178[local_38 * local_d0 + local_30]);
              }
            }
            break;
          case 0x3ea:
            if (local_50 < 2) {
              fprintf(local_8," %8ld",*(undefined8 *)(&stack0xfffffffffffff638 + local_30 * 8));
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                fprintf(local_8," %8ld",
                        *(undefined8 *)
                         (&stack0xfffffffffffff638 + (local_38 * local_d0 + local_30) * 8));
              }
            }
            break;
          case 0x3eb:
            if (local_50 < 2) {
              fprintf(local_8," %11.5f",(double)local_618[local_30]);
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                fprintf(local_8," %11.5f",(double)local_618[local_38 * local_d0 + local_30]);
              }
            }
            break;
          case 0x3ec:
            if (local_50 < 2) {
              if (100000.0 < local_2c8[local_30] || local_2c8[local_30] == 100000.0) {
                fprintf(local_8," %.5e",local_2c8[local_30]);
              }
              else {
                fprintf(local_8," %11.5f",local_2c8[local_30]);
              }
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                if (100000.0 < local_2c8[local_38 * local_d0 + local_30] ||
                    local_2c8[local_38 * local_d0 + local_30] == 100000.0) {
                  fprintf(local_8," %.5e",local_2c8[local_38 * local_d0 + local_30]);
                }
                else {
                  fprintf(local_8," %11.5f",local_2c8[local_38 * local_d0 + local_30]);
                }
              }
            }
            break;
          default:
            pnga_error(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
            break;
          case 0x3ee:
            if (local_50 < 2) {
              if ((100000.0 <= local_7f8[local_30 * 2]) || (100000.0 <= local_7f8[local_30 * 2 + 1])
                 ) {
                fprintf(local_8," %.5e,%.5e",(double)local_7f8[local_30 * 2],
                        (double)local_7f8[local_30 * 2 + 1]);
              }
              else {
                fprintf(local_8," %11.5f,%11.5f",(double)local_7f8[local_30 * 2],
                        (double)local_7f8[local_30 * 2 + 1]);
              }
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                if ((100000.0 <= local_7f8[(local_38 * local_d0 + local_30) * 2]) ||
                   (100000.0 <= local_7f8[(local_38 * local_d0 + local_30) * 2 + 1])) {
                  fprintf(local_8," %.5e,%.5e",
                          (double)local_7f8[(local_38 * local_d0 + local_30) * 2],
                          (double)local_7f8[(local_38 * local_d0 + local_30) * 2 + 1]);
                }
                else {
                  fprintf(local_8," %11.5f,%11.5f",
                          (double)local_7f8[(local_38 * local_d0 + local_30) * 2],
                          (double)local_7f8[(local_38 * local_d0 + local_30) * 2 + 1]);
                }
              }
            }
            break;
          case 0x3ef:
            if (local_50 < 2) {
              if ((100000.0 < local_568[local_30 * 2] || local_568[local_30 * 2] == 100000.0) ||
                 (100000.0 < local_568[local_30 * 2 + 1] || local_568[local_30 * 2 + 1] == 100000.0)
                 ) {
                fprintf(local_8," %.5e,%.5e",local_568[local_30 * 2],local_568[local_30 * 2 + 1]);
              }
              else {
                fprintf(local_8," %11.5f,%11.5f",local_568[local_30 * 2],local_568[local_30 * 2 + 1]
                       );
              }
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                if ((100000.0 < local_568[(local_38 * local_d0 + local_30) * 2] ||
                     local_568[(local_38 * local_d0 + local_30) * 2] == 100000.0) ||
                   (100000.0 < local_568[(local_38 * local_d0 + local_30) * 2 + 1] ||
                    local_568[(local_38 * local_d0 + local_30) * 2 + 1] == 100000.0)) {
                  fprintf(local_8," %.5e,%.5e",local_568[(local_38 * local_d0 + local_30) * 2],
                          local_568[(local_38 * local_d0 + local_30) * 2 + 1]);
                }
                else {
                  fprintf(local_8," %11.5f,%11.5f",local_568[(local_38 * local_d0 + local_30) * 2],
                          local_568[(local_38 * local_d0 + local_30) * 2 + 1]);
                }
              }
            }
            break;
          case 0x3f8:
            if (local_50 < 2) {
              fprintf(local_8," %8lld",local_b18[local_30]);
            }
            else {
              for (local_38 = 0; local_38 < (local_878[1] - local_838[1]) + 1;
                  local_38 = local_38 + 1) {
                fprintf(local_8," %8lld",local_b18[local_38 * local_d0 + local_30]);
              }
            }
          }
          fprintf(local_8,"\n");
        }
        local_838[0] = local_878[0] + 1;
        if (*local_20 < local_838[0] + local_d0 + -1) {
          local_b80 = *local_20;
        }
        else {
          local_b80 = local_838[0] + local_d0 + -1;
        }
        local_878[0] = local_b80;
        for (local_30 = 0; local_30 < local_50; local_30 = local_30 + 1) {
          if (local_20[local_30] < local_838[local_30]) {
            if (local_30 == local_50 + -1) {
              bVar1 = false;
            }
            else {
              local_838[local_30] = *(long *)(local_18 + local_30 * 8);
              if ((local_30 == 0) || (local_30 == 1)) {
                if (local_20[local_30] < local_838[local_30] + local_d0 + -1) {
                  local_b88 = local_20[local_30];
                }
                else {
                  local_b88 = local_838[local_30] + local_d0 + -1;
                }
                local_878[local_30] = local_b88;
              }
              else {
                local_878[local_30] = *(long *)(local_18 + local_30 * 8);
              }
              if (local_30 == 0) {
                lVar6 = local_878[1] + 1;
                if (local_20[1] < local_838[1] + local_d0 + -1) {
                  local_b90 = local_20[1];
                }
                else {
                  local_b90 = local_838[1] + local_d0 + -1;
                }
                local_878[1] = local_b90;
                local_838[1] = lVar6;
              }
              else {
                local_838[local_30 + 1] = local_838[local_30 + 1] + 1;
                local_878[local_30 + 1] = local_878[local_30 + 1] + 1;
              }
              if (local_30 == 0) {
                bVar3 = true;
              }
              if (local_30 == 1) {
                bVar2 = true;
              }
            }
          }
        }
      }
    }
    fflush(local_8);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_print_patch_file(file, g_a, lo, hi, pretty)
        Integer g_a, *lo, *hi, pretty;
        FILE *file;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 

    Integer i, j;
    Integer type;
    char *name;
    Integer ndim, dims[MAXDIM], ld[MAXDIM];
    Integer bufsize;
    int ibuf[BUFSIZE], ibuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dbuf[BUFSIZE], dbuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dcbuf[2*BUFSIZE], dcbuf_2d[2*BUFSIZE*BUFSIZE];
    float fbuf[BUFSIZE], fbuf_2d[BUFSIZE*BUFSIZE];
    float fcbuf[2*BUFSIZE], fcbuf_2d[3*BUFSIZE*BUFSIZE];
    Integer lop[MAXDIM], hip[MAXDIM];
    long lbuf[BUFSIZE], lbuf_2d[BUFSIZE*BUFSIZE];
    long long llbuf[BUFSIZE], llbuf_2d[BUFSIZE*BUFSIZE];
    Integer done, status_2d, status_3d;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    pnga_sync();
    pnga_check_handle(g_a, "nga_print");

    /* only the first process print the array */
    if(pnga_nodeid() == 0) {
        
        pnga_inquire(g_a,  &type, &ndim, dims);
        pnga_inquire_name(g_a, &name);
        
        /* check the boundary */
        for(i=0; i<ndim; i++)
            if(lo[i] <= 0 || hi[i] > dims[i]) 
                pnga_error("g_a indices out of range ", g_a);
        
        /* print the general information */
        fprintf(file,"\n global array: %s[", name);
        for(i=0; i<ndim; i++)
            if(i != (ndim-1))
                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
            else
                fprintf(file, "%ld:%ld",  (long)lo[i], (long)hi[i]);
        fprintf(file,"],  handle: %d \n", (int)g_a);
        
        bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
        bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;
        
        for(i=0; i<ndim; i++) ld[i] = bufsize;
        
        if(!pretty) {
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i]; hip[i] = lo[i];
            }
            hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
            while(done) {
                switch(type) {
                    case C_INT:      pnga_get(g_a, lop, hip, ibuf, ld); break;
                    case C_DBL:      pnga_get(g_a, lop, hip, dbuf, ld); break;
                    case C_DCPL:     pnga_get(g_a, lop, hip, dcbuf, ld); break;
                    case C_FLOAT:    pnga_get(g_a, lop, hip, fbuf, ld); break; 
                    case C_SCPL:     pnga_get(g_a, lop, hip, fcbuf, ld); break;
                    case C_LONG:     pnga_get(g_a, lop, hip, lbuf, ld); break; 
                    case C_LONGLONG: pnga_get(g_a, lop, hip, llbuf,ld); break;
                    default: pnga_error("ga_print: wrong type",0);
                }
                
                /* print the array */
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%s(", name);
                    for(j=0; j<ndim; j++)
                        if((j == 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]+i);
                        else if((j != 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]);
                        else if((j == 0) && (j != (ndim-1)))
                            fprintf(file, "%ld,", (long)lop[j]+i);
                        else fprintf(file, "%ld,", (long)lop[j]);
                    switch(type) {
                        case C_INT:
                            fprintf(file,") = %d\n", ibuf[i]);break;
                        case C_LONG:
                            fprintf(file,") = %ld\n", lbuf[i]);break;
                        case C_LONGLONG:
                            fprintf(file,") = %lld\n", llbuf[i]);break;
                        case C_DBL:
                            if((double)dbuf[i]<100000.0)
                                fprintf(file,") = %f\n", dbuf[i]);
                            else fprintf(file,") = %e\n", dbuf[i]);
                            break;
                        case C_DCPL:
                            if(((double)dcbuf[i*2]<100000.0) &&
                               ((double)dcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            break;
                        case C_SCPL:
                            if(((float)fcbuf[i*2]<100000.0) &&
                               ((float)fcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            break;
                        case C_FLOAT: fprintf(file,") = %f\n", fbuf[i]);break; 
                    }
                }
                
                fflush(file);
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            if(i == 0) hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            else hip[i] = lo[i];
                            lop[i+1]++; hip[i+1]++;
                        }
                    }
                }
            }
        }
        else {
            /* pretty print */
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i];
                if((i == 0) || (i == 1))
                    hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                else 
                    hip[i] = lo[i];
            }
            
            status_2d = 1; status_3d = 1;
            
            while(done) {
                if(status_3d && (ndim > 2)) { /* print the patch info */
                    fprintf(file,"\n -- patch: %s[", name);
                    for(i=0; i<ndim; i++)
                        if(i < 2)
                            if(i != (ndim-1))
                                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
                            else
                                fprintf(file, "%ld:%ld", (long)lo[i], (long)hi[i]);
                        else
                            if(i != (ndim-1))
                                fprintf(file, "%ld,", (long)lop[i]);
                            else
                                fprintf(file, "%ld", (long)lop[i]);
                    fprintf(file,"]\n"); status_3d = 0;
                }
                
                if(status_2d &&(ndim > 1)) {
                    fprintf(file, "\n"); 
                    switch(type) {
                        case C_INT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONGLONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_DBL:
                            fprintf(file, "   ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%10ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------");
                            break;
                        case C_DCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_SCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_FLOAT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                       default:
                         pnga_error("ga_print: wrong type", 0);
                    }
                    
                    fprintf(file,"\n");
                    status_2d = 0;
                }
                
                switch(type) {
                    case C_INT: pnga_get(g_a, lop, hip, ibuf_2d, ld); break;
                    case C_LONG: pnga_get(g_a, lop, hip,lbuf_2d, ld); break;
                    case C_LONGLONG: pnga_get(g_a, lop, hip,llbuf_2d,ld);break;
                    case C_DBL: pnga_get(g_a, lop, hip, dbuf_2d, ld); break;
                    case C_DCPL: pnga_get(g_a, lop, hip, dcbuf_2d, ld);break;
                    case C_FLOAT: pnga_get(g_a, lop, hip, fbuf_2d, ld);break;
                    case C_SCPL: pnga_get(g_a, lop, hip, fcbuf_2d, ld);break;  
                   default: pnga_error("ga_print: wrong type",0);
                }
                
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%4ld  ", (long)(lop[0]+i));
                    switch(type) {
                        case C_INT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8d", ibuf_2d[j*bufsize+i]);
                            else fprintf(file," %8d", ibuf_2d[i]);
                            break;
                        case C_LONG:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8ld",lbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8ld",lbuf_2d[i]);
                            break;
                        case C_LONGLONG:
                            if(ndim > 1)
                               for(j=0; j<(hip[1]-lop[1]+1); j++)
                                  fprintf(file," %8lld",llbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8lld",llbuf_2d[i]);
                            break;
                        case C_DBL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if((double)dbuf_2d[j*bufsize+i]<100000.0)
                                        fprintf(file," %11.5f",
                                                dbuf_2d[j*bufsize+i]);
                                    else
                                        fprintf(file," %.5e",
                                                dbuf_2d[j*bufsize+i]);
                            else
                                if((double)dbuf_2d[i]<100000.0)
                                    fprintf(file," %11.5f",dbuf_2d[i]);
                                else
                                    fprintf(file," %.5e",dbuf_2d[i]);
                            break;
                        case C_FLOAT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %11.5f", fbuf_2d[j*bufsize+i]);
                            else fprintf(file," %11.5f", fbuf_2d[i]);
                            break;           
                        case C_DCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((double)dcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((double)dcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((double)dcbuf_2d[i*2]<100000.0) &&
                                   ((double)dcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
			    break;
                        case C_SCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((float)fcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((float)fcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((float)fcbuf_2d[i*2]<100000.0) &&
                                   ((float)fcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                            break;
                       default:
                          pnga_error("ga_print: wrong data type", 0);
                    }
                    
                    fprintf(file,"\n");
                }
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            
                            if((i == 0) || (i == 1)) {
                                hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            } else {
                                hip[i] = lo[i];
                            }
                            
                            if(i == 0) {
                                lop[i+1] = hip[i+1]+1;
                                hip[i+1] = GA_MIN(lop[i+1]+bufsize-1, hi[i+1]);
                            } else {
                                lop[i+1]++; hip[i+1]++;
                            }
                            
                            if(i == 0) status_2d = 1;
                            if(i == 1) status_3d = 1;
                        }
                    }
                }
            }
        }
        fflush(file);
    }
    
    pnga_sync();
}